

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

bool Map_InsertObject(PCASC_MAP pMap,void *pvNewObject,void *pvKey)

{
  bool bVar1;
  uint local_34;
  DWORD dwHashIndex;
  void *pvExistingObject;
  void *pvKey_local;
  void *pvNewObject_local;
  PCASC_MAP pMap_local;
  
  if (pMap == (PCASC_MAP)0x0) {
    pMap_local._7_1_ = false;
  }
  else if (pMap->ItemCount + 1 < pMap->TableSize) {
    for (local_34 = CalcHashIndex_Key(pMap,pvKey); pMap->HashTable[local_34] != (void *)0x0;
        local_34 = (uint)((ulong)(local_34 + 1) % pMap->TableSize)) {
      bVar1 = CompareObject_Key(pMap,pMap->HashTable[local_34],pvKey);
      if (bVar1) {
        return false;
      }
    }
    pMap->HashTable[local_34] = pvNewObject;
    pMap->ItemCount = pMap->ItemCount + 1;
    pMap_local._7_1_ = true;
  }
  else {
    pMap_local._7_1_ = false;
  }
  return pMap_local._7_1_;
}

Assistant:

bool Map_InsertObject(PCASC_MAP pMap, void * pvNewObject, void * pvKey)
{
    void * pvExistingObject;
    DWORD dwHashIndex;

    // Verify pointer to the map
    if(pMap != NULL)
    {
        // Limit check
        if((pMap->ItemCount + 1) >= pMap->TableSize)
            return false;

        // Construct the hash index
        dwHashIndex = CalcHashIndex_Key(pMap, pvKey);
        while(pMap->HashTable[dwHashIndex] != NULL)
        {
            // Get the pointer at that position
            pvExistingObject = pMap->HashTable[dwHashIndex];

            // Check if hash being inserted conflicts with an existing hash
            if(CompareObject_Key(pMap, pvExistingObject, pvKey))
                return false;

            // Move to the next entry
            dwHashIndex = (dwHashIndex + 1) % pMap->TableSize;
        }

        // Insert at that position
        pMap->HashTable[dwHashIndex] = pvNewObject;
        pMap->ItemCount++;
        return true;
    }

    // Failed
    return false;
}